

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O2

void libtorrent::rc4_init(uchar *in,size_t len,rc4 *state)

{
  uchar uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  array<std::uint8_t,_key_size> key;
  
  sVar3 = 0x100;
  if (len < 0x100) {
    sVar3 = len;
  }
  state->x = 0;
  for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
    uVar1 = in[sVar4];
    iVar2 = state->x;
    state->x = iVar2 + 1;
    (state->buf).super_array<unsigned_char,_256UL>._M_elems[iVar2] = uVar1;
  }
  memcpy(&key,&state->buf,0x100);
  iVar2 = state->x;
  for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
    (state->buf).super_array<unsigned_char,_256UL>._M_elems[lVar5] = (uchar)lVar5;
  }
  bVar6 = 0;
  iVar7 = 0;
  for (lVar5 = 8; lVar5 != 0x108; lVar5 = lVar5 + 1) {
    uVar1 = (state->buf).super_array<unsigned_char,_256UL>._M_elems[lVar5 + -8];
    lVar8 = (long)iVar7;
    iVar7 = iVar7 + 1;
    bVar6 = bVar6 + uVar1 + key.super_array<unsigned_char,_256UL>._M_elems[lVar8];
    if (iVar7 == iVar2) {
      iVar7 = 0;
    }
    (state->buf).super_array<unsigned_char,_256UL>._M_elems[lVar5 + -8] =
         (state->buf).super_array<unsigned_char,_256UL>._M_elems[bVar6];
    (state->buf).super_array<unsigned_char,_256UL>._M_elems[bVar6] = uVar1;
  }
  state->x = 0;
  state->y = 0;
  return;
}

Assistant:

void rc4_init(const unsigned char* in, std::size_t len, rc4 *state)
{
	std::size_t const key_size = sizeof(state->buf);
	aux::array<std::uint8_t, key_size> key;
	std::uint8_t tmp, *s;
	int keylen, x, y, j;

	TORRENT_ASSERT(state != nullptr);
	TORRENT_ASSERT(len <= key_size);
	if (len > key_size) len = key_size;

	state->x = 0;
	while (len--) {
		state->buf[state->x++] = *in++;
	}

	/* extract the key */
	s = state->buf.data();
	std::memcpy(key.data(), s, key_size);
	keylen = state->x;

	/* make RC4 perm and shuffle */
	for (x = 0; x < int(key_size); ++x) {
		s[x] = x & 0xff;
	}

	for (j = x = y = 0; x < int(key_size); x++) {
		y = (y + state->buf[x] + key[j++]) & 255;
		if (j == keylen) {
			j = 0;
		}
		tmp = s[x]; s[x] = s[y]; s[y] = tmp;
	}
	state->x = 0;
	state->y = 0;
}